

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disflow.c
# Opt level: O1

void fill_flow_field_borders(double *flow,int width,int height,int stride)

{
  size_t __n;
  ulong uVar1;
  double *pdVar2;
  long lVar3;
  double *row;
  ulong uVar4;
  long lVar5;
  double *row_1;
  
  lVar5 = (long)stride;
  uVar1 = (ulong)(uint)height;
  pdVar2 = flow;
  uVar4 = uVar1;
  if (0 < height) {
    do {
      pdVar2[-2] = *pdVar2;
      pdVar2[-1] = *pdVar2;
      uVar4 = uVar4 - 1;
      pdVar2 = pdVar2 + lVar5;
    } while (uVar4 != 0);
  }
  if (0 < height) {
    pdVar2 = flow + width;
    do {
      *pdVar2 = pdVar2[-1];
      pdVar2[1] = pdVar2[-1];
      pdVar2 = pdVar2 + lVar5;
      uVar1 = uVar1 - 1;
    } while (uVar1 != 0);
  }
  __n = (long)width * 8 + 0x20;
  pdVar2 = flow + lVar5 * -2 + -2;
  lVar3 = 2;
  do {
    memcpy(pdVar2,flow + -2,__n);
    pdVar2 = pdVar2 + lVar5;
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  pdVar2 = flow + height * lVar5 + -2;
  lVar3 = 2;
  do {
    memcpy(pdVar2,flow + (long)((height + -1) * stride) + -2,__n);
    pdVar2 = pdVar2 + lVar5;
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  return;
}

Assistant:

static void fill_flow_field_borders(double *flow, int width, int height,
                                    int stride) {
  // Calculate the bounds of the rectangle which was filled in by
  // compute_flow_field() before calling this function.
  // These indices are inclusive on both ends.
  const int left_index = FLOW_BORDER_INNER;
  const int right_index = (width - FLOW_BORDER_INNER - 1);
  const int top_index = FLOW_BORDER_INNER;
  const int bottom_index = (height - FLOW_BORDER_INNER - 1);

  // Left area
  for (int i = top_index; i <= bottom_index; i += 1) {
    double *row = flow + i * stride;
    const double left = row[left_index];
    for (int j = -FLOW_BORDER_OUTER; j < left_index; j++) {
      row[j] = left;
    }
  }

  // Right area
  for (int i = top_index; i <= bottom_index; i += 1) {
    double *row = flow + i * stride;
    const double right = row[right_index];
    for (int j = right_index + 1; j < width + FLOW_BORDER_OUTER; j++) {
      row[j] = right;
    }
  }

  // Top area
  const double *top_row = flow + top_index * stride - FLOW_BORDER_OUTER;
  for (int i = -FLOW_BORDER_OUTER; i < top_index; i++) {
    double *row = flow + i * stride - FLOW_BORDER_OUTER;
    size_t length = width + 2 * FLOW_BORDER_OUTER;
    memcpy(row, top_row, length * sizeof(*row));
  }

  // Bottom area
  const double *bottom_row = flow + bottom_index * stride - FLOW_BORDER_OUTER;
  for (int i = bottom_index + 1; i < height + FLOW_BORDER_OUTER; i++) {
    double *row = flow + i * stride - FLOW_BORDER_OUTER;
    size_t length = width + 2 * FLOW_BORDER_OUTER;
    memcpy(row, bottom_row, length * sizeof(*row));
  }
}